

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall
perfetto::TracingServiceImpl::EmitStats
          (TracingServiceImpl *this,TracingSession *tracing_session,
          vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets)

{
  size_t packets_00;
  TracePacket *pTVar1;
  Message *msg;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1b8;
  TraceStats local_1a0;
  undefined1 local_e0 [8];
  HeapBuffered<perfetto::protos::pbzero::TracePacket> packet;
  vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *packets_local;
  TracingSession *tracing_session_local;
  TracingServiceImpl *this_local;
  
  packet.msg_.root_arena_.blocks_.
  super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>.
  _M_impl._M_node._M_size = (size_t)packets;
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::HeapBuffered
            ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_e0);
  pTVar1 = protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                     ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_e0);
  protos::pbzero::TracePacket::set_trusted_uid(pTVar1,this->uid_);
  pTVar1 = protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                     ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_e0);
  protos::pbzero::TracePacket::set_trusted_packet_sequence_id(pTVar1,1);
  GetTraceStats(&local_1a0,this,tracing_session);
  pTVar1 = protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::operator->
                     ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_e0);
  msg = &protos::pbzero::TracePacket::set_trace_stats<perfetto::protos::pbzero::TraceStats>(pTVar1)
         ->super_Message;
  protos::gen::TraceStats::Serialize(&local_1a0,msg);
  protos::gen::TraceStats::~TraceStats(&local_1a0);
  packets_00 = packet.msg_.root_arena_.blocks_.
               super__List_base<protozero::MessageArena::Block,_std::allocator<protozero::MessageArena::Block>_>
               ._M_impl._M_node._M_size;
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::SerializeAsArray
            (&local_1b8,(HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_e0);
  anon_unknown_4::SerializeAndAppendPacket
            ((vector<perfetto::TracePacket,_std::allocator<perfetto::TracePacket>_> *)packets_00,
             &local_1b8);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector(&local_1b8);
  protozero::HeapBuffered<perfetto::protos::pbzero::TracePacket>::~HeapBuffered
            ((HeapBuffered<perfetto::protos::pbzero::TracePacket> *)local_e0);
  return;
}

Assistant:

void TracingServiceImpl::EmitStats(TracingSession* tracing_session,
                                   std::vector<TracePacket>* packets) {
  protozero::HeapBuffered<protos::pbzero::TracePacket> packet;
  packet->set_trusted_uid(static_cast<int32_t>(uid_));
  packet->set_trusted_packet_sequence_id(kServicePacketSequenceID);
  GetTraceStats(tracing_session).Serialize(packet->set_trace_stats());
  SerializeAndAppendPacket(packets, packet.SerializeAsArray());
}